

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImDrawList * GetViewportDrawList(ImGuiViewportP *viewport,size_t drawlist_no,char *drawlist_name)

{
  ImVec2 cr_min;
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  ImDrawList *this;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  ImVec2 cr_max;
  undefined1 auVar4 [32];
  
  pIVar2 = GImGui;
  this = viewport->DrawLists[drawlist_no];
  if (this == (ImDrawList *)0x0) {
    this = (ImDrawList *)ImGui::MemAlloc(200);
    auVar4 = ZEXT1632(ZEXT816(0) << 0x40);
    auVar3 = auVar4._0_16_;
    (this->VtxBuffer).Size = auVar3._0_4_;
    (this->VtxBuffer).Capacity = auVar3._4_4_;
    (this->VtxBuffer).Data = (ImDrawVert *)auVar3._8_8_;
    this->Flags = auVar4._16_4_;
    this->_VtxCurrentIdx = auVar4._20_4_;
    this->_Data = (ImDrawListSharedData *)auVar4._24_8_;
    this->_OwnerName = (char *)auVar4._0_8_;
    this->_VtxWritePtr = (ImDrawVert *)auVar4._8_8_;
    this->_IdxWritePtr = (ImDrawIdx *)auVar4._16_8_;
    (this->_ClipRectStack).Size = auVar4._24_4_;
    (this->_ClipRectStack).Capacity = auVar4._28_4_;
    auVar4 = ZEXT1632(ZEXT816(0) << 0x40);
    auVar3 = auVar4._0_16_;
    auVar5 = auVar4._16_16_;
    (this->CmdBuffer).Size = auVar3._0_4_;
    (this->CmdBuffer).Capacity = auVar3._4_4_;
    (this->CmdBuffer).Data = (ImDrawCmd *)auVar3._8_8_;
    (this->IdxBuffer).Size = auVar5._0_4_;
    (this->IdxBuffer).Capacity = auVar5._4_4_;
    (this->IdxBuffer).Data = (unsigned_short *)auVar5._8_8_;
    *(undefined1 (*) [32])&(this->_ClipRectStack).Data = auVar4;
    *(undefined1 (*) [32])&(this->_Path).Data = auVar4;
    *(undefined8 *)&this->_FringeScale = 0;
    *(undefined1 (*) [32])&(this->_CmdHeader).VtxOffset = auVar4;
    this->_Data = &pIVar2->DrawListSharedData;
    this->_OwnerName = drawlist_name;
    viewport->DrawLists[drawlist_no] = this;
  }
  if (viewport->DrawListsLastFrame[drawlist_no] != pIVar2->FrameCount) {
    ImDrawList::_ResetForNewFrame(this);
    ImDrawList::PushTextureID(this,((pIVar2->IO).Fonts)->TexID);
    cr_min = (viewport->super_ImGuiViewport).Pos;
    IVar1 = (viewport->super_ImGuiViewport).Size;
    cr_max.x = IVar1.x + cr_min.x;
    cr_max.y = IVar1.y + cr_min.y;
    ImDrawList::PushClipRect(this,cr_min,cr_max,false);
    viewport->DrawListsLastFrame[drawlist_no] = pIVar2->FrameCount;
  }
  return this;
}

Assistant:

static ImDrawList* GetViewportDrawList(ImGuiViewportP* viewport, size_t drawlist_no, const char* drawlist_name)
{
    // Create the draw list on demand, because they are not frequently used for all viewports
    ImGuiContext& g = *GImGui;
    IM_ASSERT(drawlist_no < IM_ARRAYSIZE(viewport->DrawLists));
    ImDrawList* draw_list = viewport->DrawLists[drawlist_no];
    if (draw_list == NULL)
    {
        draw_list = IM_NEW(ImDrawList)(&g.DrawListSharedData);
        draw_list->_OwnerName = drawlist_name;
        viewport->DrawLists[drawlist_no] = draw_list;
    }

    // Our ImDrawList system requires that there is always a command
    if (viewport->DrawListsLastFrame[drawlist_no] != g.FrameCount)
    {
        draw_list->_ResetForNewFrame();
        draw_list->PushTextureID(g.IO.Fonts->TexID);
        draw_list->PushClipRect(viewport->Pos, viewport->Pos + viewport->Size, false);
        viewport->DrawListsLastFrame[drawlist_no] = g.FrameCount;
    }
    return draw_list;
}